

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

BOOL code_match(CodeContext *s,int pos,...)

{
  char in_AL;
  uint32_t uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int arg_1;
  int idx_1;
  int arg;
  int idx;
  BOOL ret;
  va_list ap;
  int pos_next;
  int line_num;
  int op1;
  int len;
  int op;
  uint8_t *tab;
  uint *local_168;
  uint *local_150;
  uint *local_130;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  uint local_5c;
  uint32_t local_58;
  uint local_54;
  uint local_50;
  BOOL local_4c;
  uint local_48;
  undefined4 local_44;
  uint *local_40;
  undefined1 *local_38;
  int local_2c;
  uint32_t local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  long local_18;
  int local_c;
  long *local_8;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_18 = *in_RDI;
  local_4c = 0;
  local_28 = 0xffffffff;
  local_38 = local_118;
  local_40 = (uint *)&stack0x00000008;
  local_44 = 0x30;
  local_48 = 0x10;
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  local_c = in_ESI;
  local_8 = in_RDI;
  do {
    if (local_48 < 0x29) {
      local_130 = (uint *)(local_38 + (int)local_48);
      local_48 = local_48 + 8;
    }
    else {
      local_130 = local_40;
      local_40 = local_40 + 2;
    }
    local_24 = *local_130;
    if (local_24 == 0xffffffff) {
      *(int *)((long)local_8 + 0xc) = local_c;
      *(uint32_t *)(local_8 + 2) = local_28;
      return 1;
    }
    while( true ) {
      if ((int)local_8[1] <= local_c) {
        return local_4c;
      }
      local_1c = (uint)*(byte *)(local_18 + local_c);
      local_20 = (uint)opcode_info[(int)local_1c].size;
      local_2c = local_c + local_20;
      if ((int)local_8[1] < local_2c) {
        return local_4c;
      }
      if (local_1c != 0xc0) break;
      local_28 = get_u32((uint8_t *)(local_18 + local_c + 1));
      local_c = local_2c;
    }
    if (local_1c != local_24) {
      if (local_24 == (local_24 & 0xff)) {
        return local_4c;
      }
      if (local_1c == 0) {
        return local_4c;
      }
      if ((((local_1c != (local_24 & 0xff)) && (local_1c != ((int)local_24 >> 8 & 0xffU))) &&
          (local_1c != ((int)local_24 >> 0x10 & 0xffU))) &&
         (local_1c != ((int)local_24 >> 0x18 & 0xffU))) {
        return local_4c;
      }
      *(uint *)((long)local_8 + 0x14) = local_1c;
    }
    local_c = local_c + 1;
    switch(opcode_info[(int)local_1c].fmt) {
    case '\x05':
    case '\a':
      local_50 = (uint)*(byte *)(local_18 + local_c);
      if (local_48 < 0x29) {
        local_150 = (uint *)(local_38 + (int)local_48);
        local_48 = local_48 + 8;
      }
      else {
        local_150 = local_40;
        local_40 = local_40 + 2;
      }
      local_54 = *local_150;
      if (local_54 == 0xffffffff) {
        *(uint *)(local_8 + 3) = local_50;
      }
      else if (local_54 != local_50) {
        return local_4c;
      }
      break;
    default:
      break;
    case '\n':
    case '\r':
    case '\x10':
    case '\x11':
    case '\x12':
      local_58 = get_u16((uint8_t *)(local_18 + local_c));
      if (local_48 < 0x29) {
        local_168 = (uint *)(local_38 + (int)local_48);
        local_48 = local_48 + 8;
      }
      else {
        local_168 = local_40;
        local_40 = local_40 + 2;
      }
      local_5c = *local_168;
      if (local_5c == 0xffffffff) {
        *(uint32_t *)(local_8 + 3) = local_58;
      }
      else if (local_5c != local_58) {
        return local_4c;
      }
      break;
    case '\x13':
    case '\x14':
    case '\x15':
    case '\x16':
      uVar1 = get_u32((uint8_t *)(local_18 + local_c));
      *(uint32_t *)((long)local_8 + 0x1c) = uVar1;
      break;
    case '\x17':
      uVar1 = get_u32((uint8_t *)(local_18 + local_c));
      *(uint32_t *)((long)local_8 + 0x24) = uVar1;
      break;
    case '\x18':
      uVar1 = get_u32((uint8_t *)(local_18 + local_c));
      *(uint32_t *)((long)local_8 + 0x24) = uVar1;
      uVar1 = get_u8((uint8_t *)(local_18 + local_c + 4));
      *(uint32_t *)(local_8 + 4) = uVar1;
      break;
    case '\x19':
      uVar1 = get_u32((uint8_t *)(local_18 + local_c));
      *(uint32_t *)((long)local_8 + 0x24) = uVar1;
      uVar1 = get_u16((uint8_t *)(local_18 + local_c + 4));
      *(uint32_t *)(local_8 + 4) = uVar1;
      break;
    case '\x1a':
      uVar1 = get_u32((uint8_t *)(local_18 + local_c));
      *(uint32_t *)((long)local_8 + 0x24) = uVar1;
      uVar1 = get_u32((uint8_t *)(local_18 + local_c + 4));
      *(uint32_t *)((long)local_8 + 0x1c) = uVar1;
      uVar1 = get_u8((uint8_t *)(local_18 + local_c + 8));
      *(uint32_t *)(local_8 + 4) = uVar1;
      break;
    case '\x1c':
      uVar1 = get_u32((uint8_t *)(local_18 + local_c));
      *(uint32_t *)((long)local_8 + 0x1c) = uVar1;
      uVar1 = get_u16((uint8_t *)(local_18 + local_c + 4));
      *(uint32_t *)(local_8 + 4) = uVar1;
    }
    local_c = local_2c;
  } while( true );
}

Assistant:

static BOOL code_match(CodeContext *s, int pos, ...)
{
    const uint8_t *tab = s->bc_buf;
    int op, len, op1, line_num, pos_next;
    va_list ap;
    BOOL ret = FALSE;

    line_num = -1;
    va_start(ap, pos);

    for(;;) {
        op1 = va_arg(ap, int);
        if (op1 == -1) {
            s->pos = pos;
            s->line_num = line_num;
            ret = TRUE;
            break;
        }
        for (;;) {
            if (pos >= s->bc_len)
                goto done;
            op = tab[pos];
            len = opcode_info[op].size;
            pos_next = pos + len;
            if (pos_next > s->bc_len)
                goto done;
            if (op == OP_line_num) {
                line_num = get_u32(tab + pos + 1);
                pos = pos_next;
            } else {
                break;
            }
        }
        if (op != op1) {
            if (op1 == (uint8_t)op1 || !op)
                break;
            if (op != (uint8_t)op1
            &&  op != (uint8_t)(op1 >> 8)
            &&  op != (uint8_t)(op1 >> 16)
            &&  op != (uint8_t)(op1 >> 24)) {
                break;
            }
            s->op = op;
        }

        pos++;
        switch(opcode_info[op].fmt) {
        case OP_FMT_loc8:
        case OP_FMT_u8:
            {
                int idx = tab[pos];
                int arg = va_arg(ap, int);
                if (arg == -1) {
                    s->idx = idx;
                } else {
                    if (arg != idx)
                        goto done;
                }
                break;
            }
        case OP_FMT_u16:
        case OP_FMT_npop:
        case OP_FMT_loc:
        case OP_FMT_arg:
        case OP_FMT_var_ref:
            {
                int idx = get_u16(tab + pos);
                int arg = va_arg(ap, int);
                if (arg == -1) {
                    s->idx = idx;
                } else {
                    if (arg != idx)
                        goto done;
                }
                break;
            }
        case OP_FMT_i32:
        case OP_FMT_u32:
        case OP_FMT_label:
        case OP_FMT_const:
            {
                s->label = get_u32(tab + pos);
                break;
            }
        case OP_FMT_label_u16:
            {
                s->label = get_u32(tab + pos);
                s->val = get_u16(tab + pos + 4);
                break;
            }
        case OP_FMT_atom:
            {
                s->atom = get_u32(tab + pos);
                break;
            }
        case OP_FMT_atom_u8:
            {
                s->atom = get_u32(tab + pos);
                s->val = get_u8(tab + pos + 4);
                break;
            }
        case OP_FMT_atom_u16:
            {
                s->atom = get_u32(tab + pos);
                s->val = get_u16(tab + pos + 4);
                break;
            }
        case OP_FMT_atom_label_u8:
            {
                s->atom = get_u32(tab + pos);
                s->label = get_u32(tab + pos + 4);
                s->val = get_u8(tab + pos + 8);
                break;
            }
        default:
            break;
        }
        pos = pos_next;
    }
 done:
    va_end(ap);
    return ret;
}